

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O1

bool cmVariableWatchCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *variable;
  string *psVar1;
  cmMakefile *this;
  pointer pcVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  undefined1 *client_data;
  cmake *pcVar6;
  undefined8 *puVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string command;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_b8;
  char *local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  _Invoker_type p_Stack_a0;
  undefined1 local_98 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  _Invoker_type p_Stack_80;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  __uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_58 [2];
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  variable = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (variable == psVar1) {
    local_98._0_8_ = &local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"must be called with at least one argument.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_98._0_8_ !=
        &local_88) {
      operator_delete((void *)local_98._0_8_,(ulong)((long)&(local_88->_M_dataplus)._M_p + 1));
    }
    bVar4 = false;
  }
  else {
    local_40 = 0;
    local_38 = 0;
    local_48 = &local_38;
    if (0x20 < (ulong)((long)psVar1 - (long)variable)) {
      std::__cxx11::string::_M_assign((string *)&local_48);
    }
    iVar5 = std::__cxx11::string::compare((char *)variable);
    if (iVar5 == 0) {
      local_98._0_8_ = (pointer)0x1f;
      local_98._8_8_ = "cannot be set on the variable: ";
      local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_78._M_unused._M_object = (variable->_M_dataplus)._M_p;
      p_Stack_80 = (_Invoker_type)variable->_M_string_length;
      local_78._8_8_ = 0;
      views._M_len = 2;
      views._M_array = (iterator)local_98;
      cmCatViews(&local_d8,views);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        (ulong)(local_d8.field_2._M_allocated_capacity + 1));
      }
      bVar4 = false;
    }
    else {
      client_data = (undefined1 *)operator_new(0x28);
      *(undefined1 **)(client_data + 8) = client_data + 0x18;
      *(undefined8 *)(client_data + 0x10) = 0;
      client_data[0x18] = 0;
      *client_data = 0;
      std::__cxx11::string::operator=((string *)(client_data + 8),(string *)&local_48);
      pcVar6 = cmMakefile::GetCMakeInstance(status->Makefile);
      bVar4 = cmVariableWatch::AddWatch
                        ((pcVar6->VariableWatch)._M_t.
                         super___uniq_ptr_impl<cmVariableWatch,_std::default_delete<cmVariableWatch>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmVariableWatch_*,_std::default_delete<cmVariableWatch>_>
                         .super__Head_base<0UL,_cmVariableWatch_*,_false>._M_head_impl,variable,
                         anon_unknown.dwarf_b285fa::cmVariableWatchCommandVariableAccessed,
                         client_data,anon_unknown.dwarf_b285fa::deleteVariableWatchCallbackData);
      if (bVar4) {
        this = status->Makefile;
        pcVar2 = (variable->_M_dataplus)._M_p;
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,pcVar2,pcVar2 + variable->_M_string_length);
        puVar7 = (undefined8 *)operator_new(0x38);
        pcVar3 = local_b0;
        puVar7[1] = 0x100000001;
        *puVar7 = &PTR___Sp_counted_ptr_inplace_00a1f168;
        if (local_b8 ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_a8) {
          p_Stack_80 = p_Stack_a0;
          local_98._0_8_ = &local_88;
        }
        else {
          local_98._0_8_ = local_b8;
        }
        local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(uStack_a7,local_a8);
        local_98._8_8_ = local_b0;
        local_b0 = (char *)0x0;
        local_a8 = 0;
        puVar7[2] = this;
        puVar7[3] = puVar7 + 5;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_98._0_8_ ==
            &local_88) {
          puVar7[5] = local_88;
          puVar7[6] = p_Stack_80;
        }
        else {
          puVar7[3] = local_98._0_8_;
          puVar7[5] = local_88;
        }
        puVar7[4] = pcVar3;
        local_d8.field_2._M_allocated_capacity = 0;
        local_d8.field_2._8_8_ = 0;
        local_d8._M_dataplus._M_p = (pointer)0x0;
        local_d8._M_string_length = 0;
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_a8;
        local_d8._M_dataplus._M_p = (pointer)operator_new(0x10);
        *(undefined8 **)local_d8._M_dataplus._M_p = puVar7 + 2;
        *(undefined8 **)(local_d8._M_dataplus._M_p + 8) = puVar7;
        p_Stack_80 = std::
                     _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(anonymous_namespace)::FinalAction>
                     ::_M_invoke;
        local_98._8_8_ = local_d8._M_string_length;
        local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(anonymous_namespace)::FinalAction>
                   ::_M_manager;
        local_d8.field_2._M_allocated_capacity = 0;
        local_d8.field_2._8_8_ = 0;
        local_68 = (_Manager_type)0x0;
        p_Stack_60 = (_Invoker_type)0x0;
        local_78._M_unused._M_object = (pointer)0x0;
        local_78._8_8_ = 0;
        local_58[0]._M_t.
        super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
        super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
             (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
             (_Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)0x0;
        local_98._0_8_ = local_d8._M_dataplus._M_p;
        cmMakefile::AddGeneratorAction(this,(GeneratorAction *)local_98);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                  ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_58);
        if (local_68 != (_Manager_type)0x0) {
          (*local_68)(&local_78,&local_78,__destroy_functor);
        }
        if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (*(code *)local_88)(local_98,local_98,3);
        }
        if ((code *)local_d8.field_2._M_allocated_capacity != (code *)0x0) {
          (*(code *)local_d8.field_2._M_allocated_capacity)(&local_d8,&local_d8,3);
        }
        if (local_b8 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_a8) {
          operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
        }
      }
      else {
        anon_unknown.dwarf_b285fa::deleteVariableWatchCallbackData(client_data);
      }
    }
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    }
  }
  return bVar4;
}

Assistant:

bool cmVariableWatchCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("must be called with at least one argument.");
    return false;
  }
  std::string const& variable = args[0];
  std::string command;
  if (args.size() > 1) {
    command = args[1];
  }
  if (variable == "CMAKE_CURRENT_LIST_FILE") {
    status.SetError(cmStrCat("cannot be set on the variable: ", variable));
    return false;
  }

  auto* const data = new cmVariableWatchCallbackData;

  data->InCallback = false;
  data->Command = std::move(command);

  if (!status.GetMakefile().GetCMakeInstance()->GetVariableWatch()->AddWatch(
        variable, cmVariableWatchCommandVariableAccessed, data,
        deleteVariableWatchCallbackData)) {
    deleteVariableWatchCallbackData(data);
    return false;
  }

  status.GetMakefile().AddGeneratorAction(
    FinalAction{ &status.GetMakefile(), variable });
  return true;
}